

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absDup.c
# Opt level: O0

void Gia_ManGlaCollect(Gia_Man_t *p,Vec_Int_t *vGateClasses,Vec_Int_t **pvPis,Vec_Int_t **pvPPis,
                      Vec_Int_t **pvFlops,Vec_Int_t **pvNodes)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  Vec_Int_t *pVVar3;
  bool bVar4;
  int local_4c;
  Gia_Obj_t *pGStack_48;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vAssigned;
  Vec_Int_t **pvNodes_local;
  Vec_Int_t **pvFlops_local;
  Vec_Int_t **pvPPis_local;
  Vec_Int_t **pvPis_local;
  Vec_Int_t *vGateClasses_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManPoNum(p);
  if (iVar1 != 1) {
    __assert_fail("Gia_ManPoNum(p) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absDup.c"
                  ,0xa3,
                  "void Gia_ManGlaCollect(Gia_Man_t *, Vec_Int_t *, Vec_Int_t **, Vec_Int_t **, Vec_Int_t **, Vec_Int_t **)"
                 );
  }
  iVar1 = Vec_IntSize(vGateClasses);
  iVar2 = Gia_ManObjNum(p);
  if (iVar1 != iVar2) {
    __assert_fail("Vec_IntSize(vGateClasses) == Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absDup.c"
                  ,0xa4,
                  "void Gia_ManGlaCollect(Gia_Man_t *, Vec_Int_t *, Vec_Int_t **, Vec_Int_t **, Vec_Int_t **, Vec_Int_t **)"
                 );
  }
  p_00 = Gia_GlaCollectAssigned(p,vGateClasses);
  if (pvPis != (Vec_Int_t **)0x0) {
    pVVar3 = Vec_IntAlloc(100);
    *pvPis = pVVar3;
  }
  if (pvPPis != (Vec_Int_t **)0x0) {
    pVVar3 = Vec_IntAlloc(100);
    *pvPPis = pVVar3;
  }
  if (pvFlops != (Vec_Int_t **)0x0) {
    pVVar3 = Vec_IntAlloc(100);
    *pvFlops = pVVar3;
  }
  if (pvNodes != (Vec_Int_t **)0x0) {
    pVVar3 = Vec_IntAlloc(1000);
    *pvNodes = pVVar3;
  }
  local_4c = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p_00);
    bVar4 = false;
    if (local_4c < iVar1) {
      iVar1 = Vec_IntEntry(p_00,local_4c);
      pGStack_48 = Gia_ManObj(p,iVar1);
      bVar4 = pGStack_48 != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    iVar1 = Gia_ObjIsPi(p,pGStack_48);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjId(p,pGStack_48);
      iVar1 = Vec_IntEntry(vGateClasses,iVar1);
      if (iVar1 == 0) {
        if (pvPPis != (Vec_Int_t **)0x0) {
          pVVar3 = *pvPPis;
          iVar1 = Gia_ObjId(p,pGStack_48);
          Vec_IntPush(pVVar3,iVar1);
        }
      }
      else {
        iVar1 = Gia_ObjIsRo(p,pGStack_48);
        if (iVar1 == 0) {
          iVar1 = Gia_ObjIsAnd(pGStack_48);
          if (iVar1 == 0) {
            iVar1 = Gia_ObjIsConst0(pGStack_48);
            if (iVar1 == 0) {
              __assert_fail("Gia_ObjIsConst0(pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absDup.c"
                            ,0xb6,
                            "void Gia_ManGlaCollect(Gia_Man_t *, Vec_Int_t *, Vec_Int_t **, Vec_Int_t **, Vec_Int_t **, Vec_Int_t **)"
                           );
            }
          }
          else if (pvNodes != (Vec_Int_t **)0x0) {
            pVVar3 = *pvNodes;
            iVar1 = Gia_ObjId(p,pGStack_48);
            Vec_IntPush(pVVar3,iVar1);
          }
        }
        else if (pvFlops != (Vec_Int_t **)0x0) {
          pVVar3 = *pvFlops;
          iVar1 = Gia_ObjId(p,pGStack_48);
          Vec_IntPush(pVVar3,iVar1);
        }
      }
    }
    else if (pvPis != (Vec_Int_t **)0x0) {
      pVVar3 = *pvPis;
      iVar1 = Gia_ObjId(p,pGStack_48);
      Vec_IntPush(pVVar3,iVar1);
    }
    local_4c = local_4c + 1;
  }
  Vec_IntFree(p_00);
  return;
}

Assistant:

void Gia_ManGlaCollect( Gia_Man_t * p, Vec_Int_t * vGateClasses, Vec_Int_t ** pvPis, Vec_Int_t ** pvPPis, Vec_Int_t ** pvFlops, Vec_Int_t ** pvNodes )
{ 
    Vec_Int_t * vAssigned;
    Gia_Obj_t * pObj;
    int i;
    assert( Gia_ManPoNum(p) == 1 );
    assert( Vec_IntSize(vGateClasses) == Gia_ManObjNum(p) );
    // create included objects and their fanins
    vAssigned = Gia_GlaCollectAssigned( p, vGateClasses );
    // create additional arrays
    if ( pvPis )   *pvPis   = Vec_IntAlloc( 100 );
    if ( pvPPis )  *pvPPis  = Vec_IntAlloc( 100 );
    if ( pvFlops ) *pvFlops = Vec_IntAlloc( 100 );
    if ( pvNodes ) *pvNodes = Vec_IntAlloc( 1000 );
    Gia_ManForEachObjVec( vAssigned, p, pObj, i )
    {
        if ( Gia_ObjIsPi(p, pObj) )
            { if ( pvPis )   Vec_IntPush( *pvPis, Gia_ObjId(p,pObj) );   }
        else if ( !Vec_IntEntry(vGateClasses, Gia_ObjId(p,pObj)) )
            { if ( pvPPis )  Vec_IntPush( *pvPPis, Gia_ObjId(p,pObj) );  }
        else if ( Gia_ObjIsRo(p, pObj) )
            { if ( pvFlops ) Vec_IntPush( *pvFlops, Gia_ObjId(p,pObj) ); }
        else if ( Gia_ObjIsAnd(pObj) )
            { if ( pvNodes ) Vec_IntPush( *pvNodes, Gia_ObjId(p,pObj) ); }
        else assert( Gia_ObjIsConst0(pObj) );
    }
    Vec_IntFree( vAssigned );
}